

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
::~Heap_column(Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  
  ppEVar1 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
      ppEVar2 = ppEVar2 + 1) {
    if (*ppEVar2 !=
        (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
         *)0x0) {
      operator_delete(*ppEVar2,8);
    }
  }
  ppEVar2 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->column_).
                                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
    return;
  }
  return;
}

Assistant:

inline Heap_column<Master_matrix>::~Heap_column()
{
  for (auto* entry : column_) {
    entryPool_->destroy(entry);
  }
}